

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec
          (GpuCounterDescriptor_GpuCounterSpec *this)

{
  GpuCounterDescriptor_GpuCounterSpec *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_GpuCounterSpec_009c0d58;
  this->counter_id_ = 0;
  ::std::__cxx11::string::string((string *)&this->name_);
  ::std::__cxx11::string::string((string *)&this->description_);
  this->int_peak_value_ = 0;
  this->double_peak_value_ = 0.0;
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ::vector(&this->numerator_units_);
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ::vector(&this->denominator_units_);
  this->select_by_default_ = false;
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ::vector(&this->groups_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<11UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec() = default;